

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

char * __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
          (ShaderImageLoadStoreBase *this,GLenum e)

{
  GLenum e_local;
  ShaderImageLoadStoreBase *this_local;
  
  if (e == 0xde0) {
    this_local = (ShaderImageLoadStoreBase *)anon_var_dwarf_51694;
  }
  else if (e == 0xde1) {
    this_local = (ShaderImageLoadStoreBase *)0x2b716ee;
  }
  else if (e == 0x806f) {
    this_local = (ShaderImageLoadStoreBase *)0x2adcea6;
  }
  else if (e == 0x84f5) {
    this_local = (ShaderImageLoadStoreBase *)anon_var_dwarf_516b5;
  }
  else if (e == 0x8513) {
    this_local = (ShaderImageLoadStoreBase *)0x2b7174d;
  }
  else if (e == 0x8c18) {
    this_local = (ShaderImageLoadStoreBase *)anon_var_dwarf_516aa;
  }
  else if (e == 0x8c1a) {
    this_local = (ShaderImageLoadStoreBase *)0x2b9dc72;
  }
  else {
    if (e != 0x9009) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x326,
                    "const char *gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::EnumToString(GLenum)"
                   );
    }
    this_local = (ShaderImageLoadStoreBase *)0x2c058bb;
  }
  return (char *)this_local;
}

Assistant:

const char* EnumToString(GLenum e)
	{
		switch (e)
		{
		case GL_TEXTURE_1D:
			return "GL_TEXTURE_1D";
		case GL_TEXTURE_2D:
			return "GL_TEXTURE_2D";
		case GL_TEXTURE_3D:
			return "GL_TEXTURE_3D";
		case GL_TEXTURE_RECTANGLE:
			return "GL_TEXTURE_RECTANGLE";
		case GL_TEXTURE_CUBE_MAP:
			return "GL_TEXTURE_CUBE_MAP";
		case GL_TEXTURE_1D_ARRAY:
			return "GL_TEXTURE_1D_ARRAY";
		case GL_TEXTURE_2D_ARRAY:
			return "GL_TEXTURE_2D_ARRAY";
		case GL_TEXTURE_CUBE_MAP_ARRAY:
			return "GL_TEXTURE_CUBE_MAP_ARRAY";

		default:
			assert(0);
			break;
		}
		return NULL;
	}